

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  ImDrawList *pIVar1;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40;
  float local_3c;
  float by;
  float bx;
  float third;
  float local_2c;
  ImGuiWindow *pIStack_28;
  float thickness;
  ImGuiWindow *window;
  ImGuiContext *g;
  float sz_local;
  ImU32 col_local;
  ImVec2 pos_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_28 = GImGui->CurrentWindow;
  g._0_4_ = sz;
  g._4_4_ = col;
  _sz_local = pos;
  local_2c = ImMax(sz / 5.0,1.0);
  g._0_4_ = -local_2c * 0.5 + g._0_4_;
  ImVec2::ImVec2((ImVec2 *)&bx,local_2c * 0.25,local_2c * 0.25);
  operator+=((ImVec2 *)&sz_local,(ImVec2 *)&bx);
  by = g._0_4_ / 3.0;
  local_3c = sz_local + by;
  local_40 = -by * 0.5 + (float)col_local + g._0_4_;
  pIVar1 = pIStack_28->DrawList;
  ImVec2::ImVec2(&local_48,local_3c - by,local_40 - by);
  ImDrawList::PathLineTo(pIVar1,&local_48);
  pIVar1 = pIStack_28->DrawList;
  ImVec2::ImVec2(&local_50,local_3c,local_40);
  ImDrawList::PathLineTo(pIVar1,&local_50);
  pIVar1 = pIStack_28->DrawList;
  ImVec2::ImVec2(&local_58,by + by + local_3c,-by + -by + local_40);
  ImDrawList::PathLineTo(pIVar1,&local_58);
  ImDrawList::PathStroke(pIStack_28->DrawList,g._4_4_,false,local_2c);
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}